

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase325::run(TestCase325 *this)

{
  SourceLocation location;
  Builder builder;
  StringPtr methodName;
  bool bVar1;
  ArrayDisposer **value;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  int iVar2;
  Maybe<capnp::MessageSize> *pMVar3;
  ArrayPtr<const_char> AVar4;
  undefined8 in_stack_fffffffffffff8b8;
  bool local_6f1;
  DebugExpression<bool_&> DStack_6f0;
  bool _kj_shouldLog_3;
  DebugExpression<bool_&> _kjCondition_3;
  int local_6e0;
  DebugExpression<int> DStack_6dc;
  bool _kj_shouldLog_2;
  undefined1 local_6d8 [8];
  DebugComparison<int,_int_&> _kjCondition_2;
  SourceLocation local_6a8;
  SourceLocation local_688;
  undefined1 local_670 [8];
  Response<capnp::DynamicStruct> response2;
  Reader local_618;
  ArrayPtr<const_char> local_5d0;
  bool local_5b9;
  undefined1 auStack_5b8 [7];
  bool _kj_shouldLog_1;
  Reader local_5a8;
  ArrayPtr<const_char> local_560;
  char (*local_550) [4];
  undefined1 local_548 [8];
  DebugComparison<const_char_(&)[4],_capnp::Text::Reader> _kjCondition_1;
  SourceLocation local_510;
  undefined1 local_4f8 [8];
  Response<capnp::DynamicStruct> response1;
  int local_4a8;
  DebugExpression<int> DStack_4a4;
  bool _kj_shouldLog;
  undefined1 local_4a0 [8];
  DebugComparison<int,_int_&> _kjCondition;
  SourceLocation local_470;
  undefined1 *local_458;
  undefined1 local_449;
  undefined1 local_448 [56];
  Promise<void> local_410;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_capability_test_c__:345:7),_capnp::Response<capnp::DynamicStruct>_>
  promise3;
  Maybe<capnp::MessageSize> local_400;
  StringPtr local_3e8;
  undefined1 local_3d8 [8];
  Request<capnp::DynamicStruct,_capnp::DynamicStruct> request3;
  undefined1 local_388 [7];
  bool barFailed;
  RemotePromise<capnp::DynamicStruct> promise2;
  StructSchema local_348;
  Builder local_340;
  BuilderFor<capnp::DynamicStruct> local_300;
  Maybe<capnp::MessageSize> local_2c8;
  ArrayPtr<const_char> local_2b0;
  undefined1 local_2a0 [8];
  Request<capnp::DynamicStruct,_capnp::DynamicStruct> request2;
  RemotePromise<capnp::DynamicStruct> promise1;
  ArrayPtr<const_char> local_1d8;
  Reader local_1c8;
  ArrayPtr<const_char> local_180;
  Maybe<capnp::MessageSize> local_168;
  ArrayPtr<const_char> local_150;
  undefined1 local_140 [8];
  Request<capnp::DynamicStruct,_capnp::DynamicStruct> request1;
  Client local_e8;
  undefined1 local_d0 [8];
  Client client;
  int callCount;
  undefined1 local_a8 [8];
  WaitScope waitScope;
  EventLoop loop;
  TestCase325 *this_local;
  
  kj::EventLoop::EventLoop((EventLoop *)&waitScope.runningStacksPool);
  kj::WaitScope::WaitScope((WaitScope *)local_a8,(EventLoop *)&waitScope.runningStacksPool);
  client.schema.super_Schema.raw._0_4_ = 0;
  kj::heap<capnp::_::TestInterfaceImpl,int&>((kj *)&request1.resultSchema,(int *)&client.schema);
  capnproto_test::capnp::test::TestInterface::Client::Client<capnp::_::TestInterfaceImpl,void>
            (&local_e8,(Own<capnp::_::TestInterfaceImpl,_std::nullptr_t> *)&request1.resultSchema);
  DynamicCapability::Client::Client<capnproto_test::capnp::test::TestInterface::Client,void>
            ((Client *)local_d0,&local_e8);
  capnproto_test::capnp::test::TestInterface::Client::~Client(&local_e8);
  kj::Own<capnp::_::TestInterfaceImpl,_std::nullptr_t>::~Own
            ((Own<capnp::_::TestInterfaceImpl,_std::nullptr_t> *)&request1.resultSchema);
  kj::StringPtr::StringPtr((StringPtr *)&local_150,"foo");
  kj::Maybe<capnp::MessageSize>::Maybe(&local_168);
  pMVar3 = &local_168;
  DynamicCapability::Client::newRequest
            ((Request<capnp::DynamicStruct,_capnp::DynamicStruct> *)local_140,(Client *)local_d0,
             (StringPtr)local_150,pMVar3);
  iVar2 = (int)pMVar3;
  kj::Maybe<capnp::MessageSize>::~Maybe(&local_168);
  kj::StringPtr::StringPtr((StringPtr *)&local_180,"i");
  DynamicValue::Reader::Reader(&local_1c8,0x7b);
  DynamicStruct::Builder::set((Builder *)local_140,(StringPtr)local_180,&local_1c8);
  DynamicValue::Reader::~Reader(&local_1c8);
  kj::StringPtr::StringPtr((StringPtr *)&local_1d8,"j");
  DynamicValue::Reader::Reader((Reader *)&promise1.super_Pipeline.typeless.ops.disposer,true);
  value = &promise1.super_Pipeline.typeless.ops.disposer;
  DynamicStruct::Builder::set((Builder *)local_140,(StringPtr)local_1d8,(Reader *)value);
  DynamicValue::Reader::~Reader((Reader *)&promise1.super_Pipeline.typeless.ops.disposer);
  Request<capnp::DynamicStruct,_capnp::DynamicStruct>::send
            ((Request<capnp::DynamicStruct,_capnp::DynamicStruct> *)&request2.resultSchema,
             (int)local_140,__buf,(size_t)value,iVar2);
  kj::StringPtr::StringPtr((StringPtr *)&local_2b0,"baz");
  kj::Maybe<capnp::MessageSize>::Maybe(&local_2c8);
  pMVar3 = &local_2c8;
  DynamicCapability::Client::newRequest
            ((Request<capnp::DynamicStruct,_capnp::DynamicStruct> *)local_2a0,(Client *)local_d0,
             (StringPtr)local_2b0,pMVar3);
  iVar2 = (int)pMVar3;
  kj::Maybe<capnp::MessageSize>::~Maybe(&local_2c8);
  kj::StringPtr::StringPtr((StringPtr *)&promise2.super_Pipeline.typeless.ops.disposer,"s");
  DynamicStruct::Builder::init((Builder *)&local_340,(EVP_PKEY_CTX *)local_2a0);
  DynamicValue::Builder::as<capnp::DynamicStruct>(&local_300,&local_340);
  builder.builder.segment = (SegmentBuilder *)local_300.builder.capTable;
  builder.schema.super_Schema.raw = (Schema)(Schema)local_300.builder.segment;
  builder.builder.capTable = (CapTableBuilder *)local_300.builder.data;
  builder.builder.data = local_300.builder.pointers;
  builder.builder.pointers = (WirePointer *)local_300.builder._32_8_;
  builder.builder.dataSize = (int)in_stack_fffffffffffff8b8;
  builder.builder.pointerCount = (short)((ulong)in_stack_fffffffffffff8b8 >> 0x20);
  builder.builder._38_2_ = (short)((ulong)in_stack_fffffffffffff8b8 >> 0x30);
  initDynamicTestMessage(builder);
  DynamicValue::Builder::~Builder(&local_340);
  Request<capnp::DynamicStruct,_capnp::DynamicStruct>::send
            ((Request<capnp::DynamicStruct,_capnp::DynamicStruct> *)local_388,(int)local_2a0,
             __buf_00,(size_t)local_348.super_Schema.raw,iVar2);
  request3.resultSchema.super_Schema.raw._7_1_ = 0;
  kj::StringPtr::StringPtr(&local_3e8,"bar");
  kj::Maybe<capnp::MessageSize>::Maybe(&local_400);
  methodName.content.size_ = local_3e8.content.size_;
  methodName.content.ptr = local_3e8.content.ptr;
  pMVar3 = &local_400;
  DynamicCapability::Client::newRequest
            ((Request<capnp::DynamicStruct,_capnp::DynamicStruct> *)local_3d8,(Client *)local_d0,
             methodName,pMVar3);
  iVar2 = (int)pMVar3;
  kj::Maybe<capnp::MessageSize>::~Maybe(&local_400);
  Request<capnp::DynamicStruct,_capnp::DynamicStruct>::send
            ((Request<capnp::DynamicStruct,_capnp::DynamicStruct> *)local_448,(int)local_3d8,
             __buf_01,local_3e8.content.size_,iVar2);
  local_458 = (undefined1 *)((long)&request3.resultSchema.super_Schema.raw + 7);
  kj::SourceLocation::SourceLocation
            (&local_470,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
             ,&DAT_009b6b8e,0x158,0x13);
  location.function = local_470.function;
  location.fileName = local_470.fileName;
  location.lineNumber = local_470.lineNumber;
  location.columnNumber = local_470.columnNumber;
  kj::Promise<capnp::Response<capnp::DynamicStruct>>::
  then<capnp::_::(anonymous_namespace)::TestCase325::run()::__0,capnp::_::(anonymous_namespace)::TestCase325::run()::__1>
            ((Promise<capnp::Response<capnp::DynamicStruct>> *)&local_410,(Type *)local_448,
             (Type *)&local_449,location);
  RemotePromise<capnp::DynamicStruct>::~RemotePromise
            ((RemotePromise<capnp::DynamicStruct> *)local_448);
  local_4a8 = 0;
  DStack_4a4 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_4a8);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int_&> *)local_4a0,&stack0xfffffffffffffb5c,(int *)&client.schema
            );
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_4a0);
  if (!bVar1) {
    response1.hook.ptr._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)response1.hook.ptr._7_1_ != false) {
      response1.hook.ptr._0_4_ = 0;
      kj::_::Debug::log<char_const(&)[36],kj::_::DebugComparison<int,int&>&,int,int&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x160,ERROR,
                 "\"failed: expected \" \"(0) == (callCount)\", _kjCondition, 0, callCount",
                 (char (*) [36])"failed: expected (0) == (callCount)",
                 (DebugComparison<int,_int_&> *)local_4a0,(int *)&response1.hook.ptr,
                 (int *)&client.schema);
      response1.hook.ptr._7_1_ = false;
    }
  }
  kj::SourceLocation::SourceLocation
            (&local_510,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
             ,&DAT_009b6b8e,0x162,0x14);
  kj::Promise<capnp::Response<capnp::DynamicStruct>_>::wait
            ((Promise<capnp::Response<capnp::DynamicStruct>_> *)local_4f8,&request2.resultSchema);
  local_550 = (char (*) [4])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [4])"foo");
  kj::StringPtr::StringPtr((StringPtr *)auStack_5b8,"x");
  DynamicStruct::Reader::get(&local_5a8,(Reader *)local_4f8,(StringPtr)_auStack_5b8);
  local_560 = (ArrayPtr<const_char>)DynamicValue::Reader::as<capnp::Text>(&local_5a8);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)local_548,
             (DebugExpression<char_const(&)[4]> *)&local_550,(Reader *)&local_560);
  DynamicValue::Reader::~Reader(&local_5a8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_548);
  if (!bVar1) {
    local_5b9 = kj::_::Debug::shouldLog(ERROR);
    while (local_5b9 != false) {
      kj::StringPtr::StringPtr((StringPtr *)&response2.hook.ptr,"x");
      DynamicStruct::Reader::get(&local_618,(Reader *)local_4f8,(StringPtr)stack0xfffffffffffff9d8);
      AVar4 = (ArrayPtr<const_char>)DynamicValue::Reader::as<capnp::Text>(&local_618);
      local_5d0 = AVar4;
      kj::_::Debug::
      log<char_const(&)[60],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Reader>&,char_const(&)[4],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x164,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (response1.get(\\\"x\\\").as<Text>())\", _kjCondition, \"foo\", response1.get(\"x\").as<Text>()"
                 ,(char (*) [60])"failed: expected (\"foo\") == (response1.get(\"x\").as<Text>())",
                 (DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)local_548,
                 (char (*) [4])"foo",(Reader *)&local_5d0);
      DynamicValue::Reader::~Reader(&local_618);
      local_5b9 = false;
    }
  }
  kj::SourceLocation::SourceLocation
            (&local_688,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
             ,&DAT_009b6b8e,0x166,0x14);
  kj::Promise<capnp::Response<capnp::DynamicStruct>_>::wait
            ((Promise<capnp::Response<capnp::DynamicStruct>_> *)local_670,local_388);
  kj::SourceLocation::SourceLocation
            (&local_6a8,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
             ,&DAT_009b6b8e,0x168,3);
  kj::Promise<void>::wait(&local_410,local_a8);
  local_6e0 = 2;
  DStack_6dc = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_6e0);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int_&> *)local_6d8,&stack0xfffffffffffff924,(int *)&client.schema
            );
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_6d8);
  if (!bVar1) {
    _kjCondition_3.value._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)_kjCondition_3.value._7_1_ != false) {
      _kjCondition_3.value._0_4_ = 2;
      kj::_::Debug::log<char_const(&)[36],kj::_::DebugComparison<int,int&>&,int,int&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x16a,ERROR,
                 "\"failed: expected \" \"(2) == (callCount)\", _kjCondition, 2, callCount",
                 (char (*) [36])"failed: expected (2) == (callCount)",
                 (DebugComparison<int,_int_&> *)local_6d8,(int *)&_kjCondition_3,
                 (int *)&client.schema);
      _kjCondition_3.value._7_1_ = false;
    }
  }
  DStack_6f0 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                          (bool *)((long)&request3.resultSchema.super_Schema.raw + 7));
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&stack0xfffffffffffff910)
  ;
  if (!bVar1) {
    local_6f1 = kj::_::Debug::shouldLog(ERROR);
    while (local_6f1 != false) {
      kj::_::Debug::log<char_const(&)[27],kj::_::DebugExpression<bool&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x16b,ERROR,"\"failed: expected \" \"barFailed\", _kjCondition",
                 (char (*) [27])"failed: expected barFailed",&stack0xfffffffffffff910);
      local_6f1 = false;
    }
  }
  Response<capnp::DynamicStruct>::~Response((Response<capnp::DynamicStruct> *)local_670);
  Response<capnp::DynamicStruct>::~Response((Response<capnp::DynamicStruct> *)local_4f8);
  kj::Promise<void>::~Promise(&local_410);
  Request<capnp::DynamicStruct,_capnp::DynamicStruct>::~Request
            ((Request<capnp::DynamicStruct,_capnp::DynamicStruct> *)local_3d8);
  RemotePromise<capnp::DynamicStruct>::~RemotePromise
            ((RemotePromise<capnp::DynamicStruct> *)local_388);
  Request<capnp::DynamicStruct,_capnp::DynamicStruct>::~Request
            ((Request<capnp::DynamicStruct,_capnp::DynamicStruct> *)local_2a0);
  RemotePromise<capnp::DynamicStruct>::~RemotePromise
            ((RemotePromise<capnp::DynamicStruct> *)&request2.resultSchema);
  Request<capnp::DynamicStruct,_capnp::DynamicStruct>::~Request
            ((Request<capnp::DynamicStruct,_capnp::DynamicStruct> *)local_140);
  DynamicCapability::Client::~Client((Client *)local_d0);
  kj::WaitScope::~WaitScope((WaitScope *)local_a8);
  kj::EventLoop::~EventLoop((EventLoop *)&waitScope.runningStacksPool);
  return;
}

Assistant:

TEST(Capability, DynamicClient) {
  kj::EventLoop loop;
  kj::WaitScope waitScope(loop);

  int callCount = 0;
  DynamicCapability::Client client =
      test::TestInterface::Client(kj::heap<TestInterfaceImpl>(callCount));

  auto request1 = client.newRequest("foo");
  request1.set("i", 123);
  request1.set("j", true);
  auto promise1 = request1.send();

  auto request2 = client.newRequest("baz");
  initDynamicTestMessage(request2.init("s").as<DynamicStruct>());
  auto promise2 = request2.send();

  bool barFailed = false;
  auto request3 = client.newRequest("bar");
  auto promise3 = request3.send().then(
      [](Response<DynamicStruct>&& response) {
        ADD_FAILURE() << "Expected bar() call to fail.";
      }, [&](kj::Exception&& e) {
        EXPECT_EQ(kj::Exception::Type::UNIMPLEMENTED, e.getType());
        barFailed = true;
      });

  EXPECT_EQ(0, callCount);

  auto response1 = promise1.wait(waitScope);

  EXPECT_EQ("foo", response1.get("x").as<Text>());

  auto response2 = promise2.wait(waitScope);

  promise3.wait(waitScope);

  EXPECT_EQ(2, callCount);
  EXPECT_TRUE(barFailed);
}